

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleShadingRenderingCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numSamples)

{
  bool bVar1;
  RenderContext *pRVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 local_1a0 [8];
  ostringstream buf;
  GLSLVersion version;
  int numSamples_local;
  SampleShadingRenderingCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  buf._372_4_ = (*pRVar2->_vptr_RenderContext[2])();
  buf._368_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports((ContextType)buf._372_4_,(ApiType)buf._368_4_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_1a0,pcVar3);
  std::operator<<(poVar4,
                  "\nin highp vec4 v_position;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\thighp float field = dot(v_position.xy, v_position.xy) + dot(21.0 * v_position.xx, sin(3.1 * v_position.xy));\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tif (fract(field) > 0.5)\n"
                 );
  if (*(int *)((long)this + 0x128) == 0) {
    std::operator<<((ostream *)local_1a0,"\t\tdiscard;\n");
  }
  else if (*(int *)((long)this + 0x128) == 1) {
    std::operator<<((ostream *)local_1a0,"\t\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  }
  std::operator<<((ostream *)local_1a0,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SampleShadingRenderingCase::genFragmentSource (int numSamples) const
{
	DE_UNREF(numSamples);
	const glu::GLSLVersion	version	= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
									? glu::GLSL_VERSION_320_ES
									: glu::GLSL_VERSION_310_ES;
	std::ostringstream		buf;

	buf <<	glu::getGLSLVersionDeclaration(version) << "\n"
			"in highp vec4 v_position;\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	highp float field = dot(v_position.xy, v_position.xy) + dot(21.0 * v_position.xx, sin(3.1 * v_position.xy));\n"
			"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
			"\n"
			"	if (fract(field) > 0.5)\n";

	if (m_type == TEST_DISCARD)
		buf <<	"		discard;\n";
	else if (m_type == TEST_COLOR)
		buf <<	"		fragColor = vec4(0.0, 0.0, 0.0, 1.0);\n";
	else
		DE_ASSERT(false);

	buf <<	"}";

	return buf.str();
}